

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O0

_Bool golf_editor_edit_entities_compare
                (golf_edit_mode_entity_t entity0,golf_edit_mode_entity_t entity1)

{
  bool local_4a;
  _Bool local_49;
  golf_edit_mode_entity_type_t local_34;
  int iStack_30;
  golf_edit_mode_entity_t entity1_local;
  golf_edit_mode_entity_type_t local_18;
  int iStack_14;
  golf_edit_mode_entity_t entity0_local;
  
  local_18 = entity0.type;
  local_34 = entity1.type;
  if (local_18 != local_34) {
    return false;
  }
  iStack_14 = entity0.idx;
  iStack_30 = entity1.idx;
  if (local_18 != GOLF_EDIT_MODE_ENTITY_FACE) {
    if (local_18 == GOLF_EDIT_MODE_ENTITY_LINE) {
      if ((iStack_14 != iStack_30) || (local_49 = true, entity0.idx2 != entity1.idx2)) {
        local_4a = iStack_14 == entity1.idx2 && entity0.idx2 == iStack_30;
        local_49 = local_4a;
      }
      return local_49;
    }
    if (local_18 != GOLF_EDIT_MODE_ENTITY_POINT) {
      return false;
    }
  }
  return iStack_14 == iStack_30;
}

Assistant:

bool golf_editor_edit_entities_compare(golf_edit_mode_entity_t entity0, golf_edit_mode_entity_t entity1) {
    if (entity0.type != entity1.type) {
        return false;
    }
    switch (entity0.type) {
        case GOLF_EDIT_MODE_ENTITY_FACE:
        case GOLF_EDIT_MODE_ENTITY_POINT:
            return entity0.idx == entity1.idx;
            break;
        case GOLF_EDIT_MODE_ENTITY_LINE:
            return (entity0.idx == entity1.idx && entity0.idx2 == entity1.idx2) ||
                (entity0.idx == entity1.idx2 && entity0.idx2 == entity1.idx);
            break;
    }
    return false;
}